

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

NodeIterator __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren
          (UArrIntermediateNode *this)

{
  IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *in_RDI;
  undefined1 local_80 [24];
  undefined1 local_68 [4];
  int in_stack_ffffffffffffff9c;
  Node *(*in_stack_ffffffffffffffa0) [5];
  anon_class_8_1_54a39801_for__func in_stack_ffffffffffffffc8;
  
  Lib::arrayIter<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*[5],int>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Lib::arrayIter<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*[5],int>(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*(&)[5],int)::{lambda(auto:1)#1},Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&>>
  ::
  filter<Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::_lambda(auto:1&)_1_>
            ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*&>_>
              *)local_68,local_80);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<int>,Lib::arrayIter<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*[5],int>(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*(&)[5],int)::{lambda(auto:1)#1},Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&>,Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::{lambda(auto:1&)#1},false>>
  ::
  map<Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::_lambda(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&)_1_>
            ((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:451:23),_false>_>
              *)&stack0xffffffffffffffc0,local_68);
  Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<int>,Lib::arrayIter<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*[5],int>(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*(&)[5],int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&>,Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::_lambda(auto:1&)_1_,false>,Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::_lambda(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&)_1_,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node**>>>
            ((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:451:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:452:20),_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
              *)in_stack_ffffffffffffffc8.a);
  return (NodeIterator)in_RDI;
}

Assistant:

NodeIterator variableChildren()
      {
        return pvi( arrayIter(_nodes, _size)
              .filter([](auto& n) { return n->term().isVar(); })
              .map([](Node *& n) { return &n; }));
      }